

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3WhereClauseClear(WhereClause *pWC)

{
  int iVar1;
  sqlite3 *db;
  WhereTerm *pWVar2;
  Expr *p;
  WhereClause *pWC_00;
  long lVar3;
  
  iVar1 = pWC->nTerm;
  if (0 < (long)iVar1) {
    db = pWC->pWInfo->pParse->db;
    pWVar2 = pWC->a;
    lVar3 = 0;
    do {
      if (((*(byte *)((long)&pWVar2->wtFlags + lVar3) & 1) != 0) &&
         (p = *(Expr **)((long)&pWVar2->pExpr + lVar3), p != (Expr *)0x0)) {
        sqlite3ExprDeleteNN(db,p);
      }
      if ((*(byte *)((long)&pWVar2->wtFlags + lVar3) & 0x30) != 0) {
        pWC_00 = *(WhereClause **)((long)&pWVar2->u + lVar3);
        sqlite3WhereClauseClear(pWC_00);
        if (pWC_00 != (WhereClause *)0x0) {
          sqlite3DbFreeNN(db,pWC_00);
        }
      }
      lVar3 = lVar3 + 0x38;
    } while ((long)iVar1 * 0x38 - lVar3 != 0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereClauseClear(WhereClause *pWC){
  sqlite3 *db = pWC->pWInfo->pParse->db;
  assert( pWC->nTerm>=pWC->nBase );
  if( pWC->nTerm>0 ){
    WhereTerm *a = pWC->a;
    WhereTerm *aLast = &pWC->a[pWC->nTerm-1];
#ifdef SQLITE_DEBUG
    int i;
    /* Verify that every term past pWC->nBase is virtual */
    for(i=pWC->nBase; i<pWC->nTerm; i++){
      assert( (pWC->a[i].wtFlags & TERM_VIRTUAL)!=0 );
    }
#endif
    while(1){
      assert( a->eMatchOp==0 || a->eOperator==WO_AUX );
      if( a->wtFlags & TERM_DYNAMIC ){
        sqlite3ExprDelete(db, a->pExpr);
      }
      if( a->wtFlags & (TERM_ORINFO|TERM_ANDINFO) ){
        if( a->wtFlags & TERM_ORINFO ){
          assert( (a->wtFlags & TERM_ANDINFO)==0 );
          whereOrInfoDelete(db, a->u.pOrInfo);
        }else{
          assert( (a->wtFlags & TERM_ANDINFO)!=0 );
          whereAndInfoDelete(db, a->u.pAndInfo);
        }
      }
      if( a==aLast ) break;
      a++;
    }
  }
}